

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O0

void png_destroy_write_struct(png_structpp png_ptr_ptr,png_infopp info_ptr_ptr)

{
  png_const_structrp png_ptr_00;
  png_structrp png_ptr;
  png_infopp info_ptr_ptr_local;
  png_structpp png_ptr_ptr_local;
  
  if ((png_ptr_ptr != (png_structpp)0x0) &&
     (png_ptr_00 = *png_ptr_ptr, png_ptr_00 != (png_const_structrp)0x0)) {
    png_destroy_info_struct(png_ptr_00,info_ptr_ptr);
    *png_ptr_ptr = (png_struct *)0x0;
    png_write_destroy(png_ptr_00);
    png_destroy_png_struct(png_ptr_00);
  }
  return;
}

Assistant:

void PNGAPI
png_destroy_write_struct(png_structpp png_ptr_ptr, png_infopp info_ptr_ptr)
{
   png_debug(1, "in png_destroy_write_struct");

   if (png_ptr_ptr != NULL)
   {
      png_structrp png_ptr = *png_ptr_ptr;

      if (png_ptr != NULL) /* added in libpng 1.6.0 */
      {
         png_destroy_info_struct(png_ptr, info_ptr_ptr);

         *png_ptr_ptr = NULL;
         png_write_destroy(png_ptr);
         png_destroy_png_struct(png_ptr);
      }
   }
}